

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MarkContext.h
# Opt level: O2

bool __thiscall Memory::MarkContext::IsEmpty(MarkContext *this)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  PagePool *pPVar5;
  undefined8 *in_FS_OFFSET;
  
  bVar3 = HasPendingObjects(this);
  if (!bVar3) {
    pPVar5 = this->pagePool;
    if (pPVar5->freePageList != (PagePoolFreePage *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/MarkContext.h"
                         ,0x59,"(pagePool->IsEmpty())","pagePool->IsEmpty()");
      if (!bVar4) goto LAB_002957cd;
      *puVar1 = 0;
      pPVar5 = this->pagePool;
    }
    if ((pPVar5->pageAllocator).disableAllocationOutOfMemory == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/MarkContext.h"
                         ,0x5a,"(!GetPageAllocator()->DisableAllocationOutOfMemory())",
                         "!GetPageAllocator()->DisableAllocationOutOfMemory()");
      if (!bVar4) {
LAB_002957cd:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar1 = 0;
    }
  }
  return !bVar3;
}

Assistant:

bool IsEmpty()
    {
        if (HasPendingObjects())
        {
            return false;
        }

        Assert(pagePool->IsEmpty());
        Assert(!GetPageAllocator()->DisableAllocationOutOfMemory());
        return true;
    }